

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

bool __thiscall roaring::Roaring64Map::contains(Roaring64Map *this,uint64_t x)

{
  _Bool _Var1;
  _Base_ptr p_Var2;
  _Rb_tree_color _Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  bool bVar6;
  
  p_Var4 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var5 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var5->_M_header;
    do {
      _Var3 = (_Rb_tree_color)(x >> 0x20);
      bVar6 = p_Var4[1]._M_color < _Var3;
      if (!bVar6) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar6];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var5) && (p_Var2[1]._M_color <= _Var3)) {
      _Var1 = roaring_bitmap_contains((roaring_bitmap_t *)&p_Var2[1]._M_parent,(uint32_t)x);
      return _Var1;
    }
  }
  return false;
}

Assistant:

bool contains(uint64_t x) const {
        auto iter = roarings.find(highBytes(x));
        if (iter == roarings.end()) {
            return false;
        }
        return iter->second.contains(lowBytes(x));
    }